

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  int iVar6;
  size_t sVar7;
  size_t err_code;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int bmi2;
  
  bmi2 = 0x1b9ad6;
  sVar7 = ZSTD_buildSeqStore(zc,src,srcSize);
  iVar6 = 1;
  if (sVar7 < 0xffffffffffffff89) {
    iVar6 = (uint)(sVar7 == 1) << 2;
  }
  if (iVar6 == 4) {
    sVar7 = 0;
LAB_001b9b29:
    pZVar5 = (zc->blockState).prevCBlock;
    if ((pZVar5->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
      (pZVar5->entropy).fse.offcode_repeatMode = FSE_repeat_check;
    }
  }
  else {
    if (iVar6 != 0) {
      return sVar7;
    }
    if ((zc->seqCollector).collectSequences == 0) {
      sVar7 = ZSTD_entropyCompressSeqStore
                        (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                         &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,dst,dstCapacity,
                         srcSize,zc->entropyWorkspace,(ulong)(uint)zc->bmi2,bmi2);
      if ((zc->seqCollector).collectSequences == 0) {
        if ((((frame == 0) || (zc->isFirstBlock != 0)) || (0x18 < sVar7)) ||
           (iVar6 = ZSTD_isRLE((BYTE *)src,srcSize), iVar6 == 0)) {
          if (sVar7 - 2 < 0xffffffffffffff87) {
            uVar2 = (zc->blockState).prevCBlock;
            uVar4 = (zc->blockState).nextCBlock;
            auVar9._8_4_ = (int)uVar2;
            auVar9._0_8_ = uVar4;
            auVar9._12_4_ = (int)((ulong)uVar2 >> 0x20);
            (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar4;
            (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar9._8_8_;
          }
        }
        else {
          *(undefined1 *)dst = *src;
          sVar7 = 1;
        }
        goto LAB_001b9b29;
      }
      ZSTD_copyBlockSequences(zc);
    }
    else {
      ZSTD_copyBlockSequences(zc);
      uVar1 = (zc->blockState).prevCBlock;
      uVar3 = (zc->blockState).nextCBlock;
      auVar8._8_4_ = (int)uVar1;
      auVar8._0_8_ = uVar3;
      auVar8._12_4_ = (int)((ulong)uVar1 >> 0x20);
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar8._8_8_;
    }
    sVar7 = 0;
  }
  return sVar7;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize, U32 frame)
{
    /* This the upper bound for the length of an rle block.
     * This isn't the actual upper bound. Finding the real threshold
     * needs further investigation.
     */
    const U32 rleMaxLength = 25;
    size_t cSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) { cSize = 0; goto out; }
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    /* encode sequences and literals */
    cSize = ZSTD_entropyCompressSeqStore(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        return 0;
    }


    if (frame &&
        /* We don't want to emit our first block as a RLE even if it qualifies because
         * doing so will cause the decoder (cli only) to throw a "should consume all input error."
         * This is only an issue for zstd <= v1.4.3
         */
        !zc->isFirstBlock &&
        cSize < rleMaxLength &&
        ZSTD_isRLE(ip, srcSize))
    {
        cSize = 1;
        op[0] = ip[0];
    }

out:
    if (!ZSTD_isError(cSize) && cSize > 1) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}